

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void tr_fixdown(int *ISAd,int *SA,int i,int size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int e;
  int d;
  int c;
  int v;
  int k;
  int j;
  int size_local;
  int i_local;
  int *SA_local;
  int *ISAd_local;
  
  iVar1 = SA[i];
  iVar2 = ISAd[iVar1];
  i_local = i;
  while( true ) {
    k = i_local * 2 + 1;
    if (size <= k) break;
    iVar3 = i_local * 2 + 2;
    d = ISAd[SA[k]];
    if (ISAd[SA[k]] < ISAd[SA[iVar3]]) {
      d = ISAd[SA[iVar3]];
      k = iVar3;
    }
    if (d <= iVar2) break;
    SA[i_local] = SA[k];
    i_local = k;
  }
  SA[i_local] = iVar1;
  return;
}

Assistant:

static INLINE
void
tr_fixdown(const int *ISAd, int *SA, int i, int size) {
  int j, k;
  int v;
  int c, d, e;

  for(v = SA[i], c = ISAd[v]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = ISAd[SA[k = j++]];
    if(d < (e = ISAd[SA[j]])) { k = j; d = e; }
    if(d <= c) { break; }
  }
  SA[i] = v;
}